

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

sexp_conflict sexp_type_of(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x)

{
  FILE *pFVar1;
  char **ppcVar2;
  
  if (x == (sexp_conflict)0x0) {
    pFVar1 = (((ctx->value).type.setters)->value).port.stream;
  }
  else {
    if (((ulong)x & 3) == 0) {
      ppcVar2 = (char **)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                         (ulong)x->tag * 8 + 8);
      goto LAB_00103988;
    }
    if (((ulong)x & 1) != 0) {
      ppcVar2 = &((((ctx->value).type.setters)->value).port.stream)->_IO_write_base;
      goto LAB_00103988;
    }
    if (((ulong)x | 0x100) == 0x13e) {
      ppcVar2 = &((((ctx->value).type.setters)->value).port.stream)->_IO_buf_base;
      goto LAB_00103988;
    }
    if (((uint)x & 0xfe) == 0x1e) {
      ppcVar2 = &((((ctx->value).type.setters)->value).port.stream)->_IO_write_end;
      goto LAB_00103988;
    }
    pFVar1 = (((ctx->value).type.setters)->value).port.stream;
    if (((uint)x & 0xe) == 6) {
      ppcVar2 = &pFVar1->_IO_save_base;
      goto LAB_00103988;
    }
  }
  ppcVar2 = &pFVar1->_IO_read_end;
LAB_00103988:
  return (sexp_conflict)*ppcVar2;
}

Assistant:

sexp sexp_type_of (sexp ctx, sexp self, sexp_sint_t n, sexp x) {
  if (!x)
    return sexp_type_by_index(ctx, SEXP_OBJECT);
  if (sexp_pointerp(x))
    return sexp_object_type(ctx, x);
  else if (sexp_fixnump(x))
    return sexp_type_by_index(ctx, SEXP_FIXNUM);
  else if (sexp_booleanp(x))
    return sexp_type_by_index(ctx, SEXP_BOOLEAN);
  else if (sexp_charp(x))
    return sexp_type_by_index(ctx, SEXP_CHAR);
#if SEXP_USE_HUFF_SYMS
  else if (sexp_symbolp(x))
    return sexp_type_by_index(ctx, SEXP_SYMBOL);
#endif
#if SEXP_USE_IMMEDIATE_FLONUMS
  else if (sexp_flonump(x))
    return sexp_type_by_index(ctx, SEXP_FLONUM);
#endif
  else
    return sexp_type_by_index(ctx, SEXP_OBJECT);
}